

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O3

void fe::operations::
     applyOperationT<fe::operations::op_unpremultipliedAlpha,fe::PixelDISTANCE,fe::PixelR8G8B8A8>
               (op_unpremultipliedAlpha *op,PixelDISTANCE *srcPixelFormat,
               PixelR8G8B8A8 *destPixelFormat,ImageData *src,ImageData *dest)

{
  float fVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  byte *pbVar10;
  byte bVar11;
  uint uVar12;
  float *pfVar13;
  int iVar14;
  byte *pbVar15;
  byte bVar16;
  uint uVar17;
  float *pfVar18;
  
  bVar7 = check(src,dest);
  if ((bVar7) && (iVar2 = (dest->super_fe_image).h, iVar2 != 0)) {
    iVar3 = (dest->super_fe_image).w;
    pbVar15 = (dest->super_fe_image).data;
    pfVar18 = (float *)(src->super_fe_image).data;
    iVar14 = 0;
    iVar6 = iVar3;
    pfVar13 = pfVar18;
    pbVar10 = pbVar15;
    do {
      for (; iVar6 != 0; iVar6 = iVar6 + -1) {
        fVar1 = *pfVar18;
        uVar12 = (uint)((fVar1 - pfVar18[1]) * 10.0);
        uVar17 = -uVar12;
        if (0 < (int)uVar12) {
          uVar17 = uVar12;
        }
        bVar16 = (byte)uVar17;
        if (0xfe < uVar17) {
          bVar16 = 0xff;
        }
        bVar7 = NAN(fVar1);
        bVar4 = fVar1 != 0.0;
        bVar5 = 0;
        bVar11 = ~bVar16;
        if (fVar1 < 0.0) {
          bVar11 = 0;
          bVar5 = ~bVar16;
        }
        bVar16 = (byte)(int)(255.0 - pfVar18[1] * 255.0);
        bVar8 = bVar16;
        if (bVar4) {
          bVar8 = 0;
        }
        if (bVar7) {
          bVar8 = 0;
        }
        bVar9 = bVar16;
        if (bVar4) {
          bVar9 = bVar5;
        }
        if (bVar7) {
          bVar9 = bVar5;
        }
        if (bVar4) {
          bVar16 = bVar11;
        }
        if (bVar7) {
          bVar16 = bVar11;
        }
        *pbVar15 = bVar16;
        pbVar15[1] = bVar9;
        pbVar15[2] = bVar8;
        pbVar15[3] = 0xff;
        pbVar15 = pbVar15 + (dest->super_fe_image).bytespp;
        pfVar18 = (float *)((long)pfVar18 + (long)(src->super_fe_image).bytespp);
      }
      pfVar18 = (float *)((long)pfVar13 + (long)(src->super_fe_image).pitch);
      pbVar15 = pbVar10 + (dest->super_fe_image).pitch;
      iVar14 = iVar14 + 1;
      iVar6 = iVar3;
      pfVar13 = pfVar18;
      pbVar10 = pbVar15;
    } while (iVar14 != iVar2);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }